

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

PHYSFS_File * doOpenWrite(char *_fname,int appending)

{
  long lVar1;
  size_t sVar2;
  void *pvVar3;
  _func_PHYSFS_Io_ptr_void_ptr_char_ptr *p_Var4;
  _func_void_PHYSFS_Io_ptr *p_Var5;
  DirHandle *h;
  ulong *puVar6;
  int iVar7;
  size_t sVar8;
  ulong *puVar9;
  PHYSFS_Io *pPVar10;
  FileHandle *pFVar11;
  ulong *puVar12;
  PHYSFS_ErrorCode errcode;
  bool bVar13;
  ulong uStack_48;
  ulong *local_40;
  char *arcfname;
  
  puVar12 = &uStack_48;
  if (_fname == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
  }
  else {
    __PHYSFS_platformGrabMutex(stateLock);
    h = writeDir;
    if (writeDir == (DirHandle *)0x0) {
      errcode = PHYSFS_ERR_NO_WRITE_DIR;
    }
    else {
      arcfname._4_4_ = appending;
      sVar8 = strlen(_fname);
      lVar1 = h->rootlen + sVar8;
      if (sVar8 + h->rootlen + 1 < 0x100) {
        puVar9 = (ulong *)((long)&uStack_48 - (lVar1 + 0x18U & 0xfffffffffffffff0));
        puVar12 = puVar9;
      }
      else {
        puVar9 = (ulong *)0x0;
        puVar12 = &uStack_48;
      }
      bVar13 = puVar9 == (ulong *)0x0;
      if (bVar13) {
        puVar12[-1] = 0x1096fb;
        puVar9 = (ulong *)(*__PHYSFS_AllocatorHooks.Malloc)(lVar1 + 9);
      }
      if (puVar9 == (ulong *)0x0) {
        puVar9 = (ulong *)0x0;
      }
      else {
        *puVar9 = (ulong)bVar13;
        puVar9 = puVar9 + 1;
      }
      if (puVar9 != (ulong *)0x0) {
        sVar2 = h->rootlen;
        puVar12[-1] = 0x109729;
        iVar7 = sanitizePlatformIndependentPath(_fname,(char *)(sVar2 + (long)puVar9));
        if (iVar7 != 0) {
          pFVar11 = (FileHandle *)0x0;
          local_40 = puVar9;
          puVar12[-1] = 0x109745;
          iVar7 = verifyPath(h,(char **)&local_40,0);
          puVar6 = local_40;
          if (iVar7 == 0) goto LAB_001097f1;
          pvVar3 = h->opaque;
          p_Var4 = (&h->funcs->openWrite)[arcfname._4_4_ != 0];
          puVar12[-1] = 0x109765;
          pPVar10 = (*p_Var4)(pvVar3,(char *)puVar6);
          if (pPVar10 != (PHYSFS_Io *)0x0) {
            puVar12[-1] = 0x10977c;
            pFVar11 = (FileHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(0x40);
            if (pFVar11 != (FileHandle *)0x0) {
              pFVar11->io = (PHYSFS_Io *)0x0;
              *(undefined8 *)&pFVar11->forReading = 0;
              pFVar11->dirHandle = (DirHandle *)0x0;
              pFVar11->buffer = (PHYSFS_uint8 *)0x0;
              pFVar11->bufpos = 0;
              pFVar11->next = (__PHYSFS_FILEHANDLE__ *)0x0;
              pFVar11->bufsize = 0;
              pFVar11->buffill = 0;
              pFVar11->io = pPVar10;
              pFVar11->dirHandle = h;
              pFVar11->next = openWriteList;
              openWriteList = pFVar11;
              goto LAB_001097f1;
            }
            p_Var5 = pPVar10->destroy;
            puVar12[-1] = 0x1097e4;
            (*p_Var5)(pPVar10);
            puVar12[-1] = 0x1097ee;
            PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
          }
        }
        pFVar11 = (FileHandle *)0x0;
LAB_001097f1:
        puVar12[-1] = 0x1097fd;
        __PHYSFS_platformReleaseMutex(stateLock);
        if (puVar9[-1] == 0) {
          return (PHYSFS_File *)pFVar11;
        }
        puVar12[-1] = 0x109811;
        (*__PHYSFS_AllocatorHooks.Free)(puVar9 + -1);
        return (PHYSFS_File *)pFVar11;
      }
      errcode = PHYSFS_ERR_OUT_OF_MEMORY;
    }
    *(undefined8 *)((long)puVar12 + -8) = 0x1097bc;
    PHYSFS_setErrorCode(errcode);
    *(undefined8 *)((long)puVar12 + -8) = 0x1097c8;
    __PHYSFS_platformReleaseMutex(stateLock);
  }
  return (PHYSFS_File *)0x0;
}

Assistant:

static PHYSFS_File *doOpenWrite(const char *_fname, const int appending)
{
    FileHandle *fh = NULL;
    DirHandle *h;
    size_t len;
    char *fname;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    __PHYSFS_platformGrabMutex(stateLock);

    h = writeDir;
    BAIL_IF_MUTEX(!h, PHYSFS_ERR_NO_WRITE_DIR, stateLock, 0);

    len = strlen(_fname) + dirHandleRootLen(h) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);

    if (sanitizePlatformIndependentPathWithRoot(h, _fname, fname))
    {
        PHYSFS_Io *io = NULL;
        char *arcfname = fname;
        if (verifyPath(h, &arcfname, 0))
        {
            const PHYSFS_Archiver *f = h->funcs;
            if (appending)
                io = f->openAppend(h->opaque, arcfname);
            else
                io = f->openWrite(h->opaque, arcfname);

            if (io)
            {
                fh = (FileHandle *) allocator.Malloc(sizeof (FileHandle));
                if (fh == NULL)
                {
                    io->destroy(io);
                    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
                } /* if */
                else
                {
                    memset(fh, '\0', sizeof (FileHandle));
                    fh->io = io;
                    fh->dirHandle = h;
                    fh->next = openWriteList;
                    openWriteList = fh;
                } /* else */
            } /* if */
        } /* if */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);

    __PHYSFS_smallFree(fname);
    return ((PHYSFS_File *) fh);
}